

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O2

int sys_argparse(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  t_namelist *ptVar3;
  int *piVar4;
  long lVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  int *piVar9;
  bool bVar10;
  double dVar11;
  undefined8 uStack_a0;
  t_audiosettings as;
  float f;
  
  sys_get_audio_settings(&as);
LAB_0016e594:
  if ((argc < 1) || (pcVar8 = *argv, *pcVar8 != '-')) goto LAB_0016f76f;
  if (pcVar8[1] == 'r') {
    bVar10 = argc != 1;
    if ((argc == 1) || (pcVar8[2] != '\0')) goto LAB_0016e5ec;
    iVar2 = __isoc99_sscanf(argv[1],"%d",&as.a_srate);
    if (iVar2 < 1) {
      pcVar8 = *argv;
      goto LAB_0016e5ec;
    }
    goto LAB_0016ee9b;
  }
  bVar10 = argc != 1;
LAB_0016e5ec:
  iVar2 = strcmp(pcVar8,"-inchannels");
  if (iVar2 == 0) {
    if (argc == 1) goto LAB_0016f788;
    pcVar8 = argv[1];
    piVar4 = &as.a_nchindev;
    piVar9 = as.a_chindevvec;
LAB_0016ee8b:
    iVar2 = sys_parsedevlist(piVar4,piVar9,4,pcVar8);
joined_r0x0016ee95:
    if (iVar2 == 0) {
LAB_0016f788:
      sys_printusage();
      return 1;
    }
  }
  else {
    iVar2 = strcmp(pcVar8,"-outchannels");
    if (iVar2 == 0) {
      if (argc == 1) goto LAB_0016f788;
LAB_0016ee7d:
      pcVar8 = argv[1];
      piVar4 = &as.a_nchoutdev;
      piVar9 = as.a_choutdevvec;
      goto LAB_0016ee8b;
    }
    iVar2 = strcmp(pcVar8,"-channels");
    if (iVar2 == 0) {
      if ((argc == 1) ||
         (iVar2 = sys_parsedevlist(&as.a_nchindev,as.a_chindevvec,4,argv[1]), iVar2 == 0))
      goto LAB_0016f788;
      goto LAB_0016ee7d;
    }
    iVar2 = strcmp(pcVar8,"-soundbuf");
    if ((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"-audiobuf"), iVar2 == 0)) {
      if (argc == 1) goto LAB_0016f788;
      as.a_advance = atoi(argv[1]);
      goto LAB_0016ee9b;
    }
    iVar2 = strcmp(pcVar8,"-callback");
    if (iVar2 == 0) {
      as.a_callback = 1;
LAB_0016ef10:
      argc = argc + -1;
      argv = argv + 1;
      goto LAB_0016e594;
    }
    iVar2 = strcmp(pcVar8,"-nocallback");
    if (iVar2 == 0) {
      as.a_callback = 0;
      goto LAB_0016ef10;
    }
    iVar2 = strcmp(pcVar8,"-blocksize");
    if (iVar2 != 0) {
      iVar2 = strcmp(pcVar8,"-sleepgrain");
      if (iVar2 == 0) {
        if (argc == 1) goto LAB_0016f788;
        dVar11 = atof(argv[1]);
        iVar2 = (int)(dVar11 * 1000.0);
        piVar4 = &sys_sleepgrain;
LAB_0016eeec:
        *piVar4 = iVar2;
        goto LAB_0016ee9b;
      }
      iVar2 = strcmp(pcVar8,"-nodac");
      if (iVar2 == 0) {
LAB_0016eefa:
        as.a_nchoutdev = 0;
        as.a_noutdev = 0;
        goto LAB_0016ef10;
      }
      iVar2 = strcmp(pcVar8,"-noadc");
      if (iVar2 == 0) {
        as.a_nchindev = 0;
        as.a_nindev = 0;
        goto LAB_0016ef10;
      }
      iVar2 = strcmp(pcVar8,"-nosound");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"-noaudio"), iVar2 == 0)) {
        as.a_nchindev = 0;
        as.a_nindev = 0;
        goto LAB_0016eefa;
      }
      iVar2 = strcmp(pcVar8,"-oss");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"-ossmidi"), iVar2 == 0)) {
        pcVar7 = "Pd compiled without OSS-support, ignoring \'%s\' flag\n";
LAB_0016f038:
        fprintf(_stderr,pcVar7,pcVar8);
        goto LAB_0016ef10;
      }
      iVar2 = strcmp(pcVar8,"-alsa");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"-alsamidi"), iVar2 == 0)) {
        pcVar7 = "Pd compiled without ALSA-support, ignoring \'%s\' flag\n";
        goto LAB_0016f038;
      }
      iVar2 = strcmp(pcVar8,"-alsaadd");
      if (iVar2 == 0) {
        if (argc == 1) goto LAB_0016f788;
        pcVar7 = "Pd compiled without ALSA-support, ignoring \'%s\' flag\n";
LAB_0016ef54:
        fprintf(_stderr,pcVar7,pcVar8);
        goto LAB_0016ee9b;
      }
      iVar2 = strcmp(pcVar8,"-jack");
      if (((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"-jackconnect"), iVar2 == 0)) ||
         (iVar2 = strcmp(pcVar8,"-nojackconnect"), iVar2 == 0)) {
        pcVar7 = "Pd compiled without JACK-support, ignoring \'%s\' flag\n";
        goto LAB_0016f038;
      }
      iVar2 = strcmp(pcVar8,"-jackname");
      if (iVar2 == 0) {
        if (argc == 1) goto LAB_0016f788;
        pcVar7 = "Pd compiled without JACK-support, ignoring \'%s\' flag\n";
        goto LAB_0016ef54;
      }
      iVar2 = strcmp(pcVar8,"-pa");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"-portaudio"), iVar2 == 0)) {
        pcVar7 = "Pd compiled without PortAudio-support, ignoring \'%s\' flag\n";
        goto LAB_0016f038;
      }
      iVar2 = strcmp(pcVar8,"-asio");
      if (iVar2 == 0) {
        pcVar7 = "Pd compiled without ASIO-support, ignoring \'%s\' flag\n";
        goto LAB_0016ef54;
      }
      iVar2 = strcmp(pcVar8,"-mmio");
      if (iVar2 == 0) {
        pcVar7 = "Pd compiled without MMIO-support, ignoring \'%s\' flag\n";
        goto LAB_0016f038;
      }
      iVar2 = strcmp(pcVar8,"-audiounit");
      if (iVar2 == 0) {
        pcVar7 = "Pd compiled without AudioUnit-support, ignoring \'%s\' flag\n";
        goto LAB_0016f038;
      }
      iVar2 = strcmp(pcVar8,"-esd");
      if (iVar2 == 0) {
        pcVar7 = "Pd compiled without ESD-support, ignoring \'%s\' flag\n";
        goto LAB_0016f038;
      }
      iVar2 = strcmp(pcVar8,"-listdev");
      if (iVar2 == 0) {
        sys_listplease = 1;
        goto LAB_0016ef10;
      }
      iVar2 = strcmp(pcVar8,"-soundindev");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"-audioindev"), iVar2 == 0)) {
        if (argc == 1) goto LAB_0016f788;
        pcVar8 = argv[1];
        piVar4 = &as.a_nindev;
        piVar9 = as.a_indevvec;
        goto LAB_0016ee8b;
      }
      iVar2 = strcmp(pcVar8,"-soundoutdev");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"-audiooutdev"), iVar2 == 0)) {
        if (argc == 1) goto LAB_0016f788;
LAB_0016f06e:
        pcVar8 = argv[1];
        piVar4 = &as.a_noutdev;
        piVar9 = as.a_outdevvec;
        goto LAB_0016ee8b;
      }
      iVar2 = strcmp(pcVar8,"-sounddev");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"-audiodev"), iVar2 == 0)) {
        if ((argc == 1) ||
           (iVar2 = sys_parsedevlist(&as.a_nindev,as.a_indevvec,4,argv[1]), iVar2 == 0))
        goto LAB_0016f788;
        goto LAB_0016f06e;
      }
      iVar2 = strcmp(pcVar8,"-audioaddindev");
      if (iVar2 == 0) {
        if (argc == 1) goto LAB_0016f788;
        if (as.a_nindev < 0) {
          as.a_nindev = 0;
        }
        else if (3 < (uint)as.a_nindev) {
LAB_0016f0bf:
          pcVar8 = "number of audio devices limited to %d\n";
LAB_0016f286:
          uStack_a0 = 4;
LAB_0016f289:
          fprintf(_stderr,pcVar8,uStack_a0);
          goto LAB_0016ee9b;
        }
        iVar2 = sys_audiodevnametonumber(0,argv[1]);
        if (-1 < iVar2) {
          lVar5 = (long)as.a_nindev;
          as.a_nindev = as.a_nindev + 1;
          as.a_indevvec[lVar5] = iVar2 + 1;
          goto LAB_0016ee9b;
        }
        pcVar8 = argv[1];
        pcVar7 = "Couldn\'t find audio input device: %s\n";
        goto LAB_0016ef54;
      }
      iVar2 = strcmp(pcVar8,"-audioaddoutdev");
      if (iVar2 == 0) {
        if (argc == 1) goto LAB_0016f788;
        if (as.a_noutdev < 0) {
          as.a_noutdev = 0;
        }
        else if (3 < (uint)as.a_noutdev) goto LAB_0016f0bf;
LAB_0016f162:
        iVar2 = sys_audiodevnametonumber(1,argv[1]);
        if (-1 < iVar2) {
          lVar5 = (long)as.a_noutdev;
          as.a_noutdev = as.a_noutdev + 1;
          as.a_outdevvec[lVar5] = iVar2 + 1;
          goto LAB_0016ee9b;
        }
        pcVar8 = argv[1];
        pcVar7 = "Couldn\'t find audio output device: %s\n";
        goto LAB_0016ef54;
      }
      iVar2 = strcmp(pcVar8,"-audioadddev");
      if (iVar2 == 0) {
        if (argc == 1) goto LAB_0016f788;
        if (as.a_nindev < 0) {
          as.a_nindev = 0;
        }
        if (as.a_noutdev < 0) {
          as.a_noutdev = 0;
        }
        if (3 < (uint)(as.a_nindev | as.a_noutdev)) {
          pcVar8 = "number of audio devices limited to %d";
          goto LAB_0016f286;
        }
        iVar2 = sys_audiodevnametonumber(0,argv[1]);
        if (iVar2 < 0) {
          fprintf(_stderr,"Couldn\'t find audio input device: %s\n",argv[1]);
        }
        else {
          lVar5 = (long)as.a_nindev;
          as.a_nindev = as.a_nindev + 1;
          as.a_indevvec[lVar5] = iVar2 + 1;
        }
        goto LAB_0016f162;
      }
      iVar2 = strcmp(pcVar8,"-nomidiin");
      if (iVar2 == 0) {
LAB_0016f19c:
        piVar4 = &sys_nmidiin;
LAB_0016f1a3:
        *piVar4 = 0;
        goto LAB_0016ef10;
      }
      iVar2 = strcmp(pcVar8,"-nomidiout");
      if (iVar2 == 0) {
        piVar4 = &sys_nmidiout;
        goto LAB_0016f1a3;
      }
      iVar2 = strcmp(pcVar8,"-nomidi");
      if (iVar2 == 0) {
        sys_nmidiout = 0;
        goto LAB_0016f19c;
      }
      iVar2 = strcmp(pcVar8,"-midiindev");
      if (iVar2 == 0) {
        if (argc == 1) goto LAB_0016f788;
        pcVar8 = argv[1];
        piVar9 = &sys_nmidiin;
        piVar4 = sys_midiindevlist;
      }
      else {
        iVar2 = strcmp(pcVar8,"-midioutdev");
        if (iVar2 == 0) {
          if (argc == 1) goto LAB_0016f788;
          pcVar8 = argv[1];
          piVar9 = &sys_nmidiout;
          piVar4 = sys_midioutdevlist;
        }
        else {
          iVar2 = strcmp(pcVar8,"-mididev");
          if (iVar2 != 0) {
            iVar2 = strcmp(pcVar8,"-midiaddindev");
            if (iVar2 == 0) {
              if (argc == 1) goto LAB_0016f788;
              if (sys_nmidiin < 0) {
                sys_nmidiin = 0;
              }
              else if (0xf < (uint)sys_nmidiin) {
LAB_0016f2fe:
                pcVar8 = "number of MIDI devices limited to %d\n";
LAB_0016f531:
                uStack_a0 = 0x10;
                goto LAB_0016f289;
              }
              iVar2 = sys_mididevnametonumber(0,argv[1]);
              if (iVar2 < 0) {
                pcVar8 = argv[1];
                pcVar7 = "Couldn\'t find MIDI input device: %s\n";
                goto LAB_0016ef54;
              }
              piVar4 = sys_midiindevlist;
              iVar1 = sys_nmidiin;
              sys_nmidiin = sys_nmidiin + 1;
            }
            else {
              iVar2 = strcmp(pcVar8,"-midiaddoutdev");
              if (iVar2 == 0) {
                if (argc == 1) goto LAB_0016f788;
                if (sys_nmidiout < 0) {
                  sys_nmidiout = 0;
                }
                else if (0xf < (uint)sys_nmidiout) goto LAB_0016f2fe;
              }
              else {
                iVar2 = strcmp(pcVar8,"-midiadddev");
                if (iVar2 != 0) {
                  iVar2 = strcmp(pcVar8,"-path");
                  if (iVar2 == 0) {
                    if (argc == 1) goto LAB_0016f788;
                    ptVar3 = namelist_append_files((pd_maininstance.pd_stuff)->st_temppath,argv[1]);
                    (pd_maininstance.pd_stuff)->st_temppath = ptVar3;
                    goto LAB_0016ee9b;
                  }
                  iVar2 = strcmp(pcVar8,"-nostdpath");
                  if (iVar2 == 0) {
                    piVar4 = &sys_usestdpath;
                    goto LAB_0016f1a3;
                  }
                  iVar2 = strcmp(pcVar8,"-stdpath");
                  if (iVar2 == 0) {
                    piVar4 = &sys_usestdpath;
                    goto LAB_0016f43d;
                  }
                  iVar2 = strcmp(pcVar8,"-helppath");
                  if (iVar2 == 0) {
                    if (argc == 1) goto LAB_0016f788;
                    ptVar3 = namelist_append_files((pd_maininstance.pd_stuff)->st_helppath,argv[1]);
                    (pd_maininstance.pd_stuff)->st_helppath = ptVar3;
                  }
                  else {
                    iVar2 = strcmp(pcVar8,"-open");
                    if (iVar2 == 0) {
                      if (argc == 1) goto LAB_0016f788;
                      sys_openlist = namelist_append_files(sys_openlist,argv[1]);
                    }
                    else {
                      iVar2 = strcmp(pcVar8,"-lib");
                      if (iVar2 == 0) {
                        if (argc == 1) goto LAB_0016f788;
                        ptVar3 = namelist_append_files
                                           ((pd_maininstance.pd_stuff)->st_externlist,argv[1]);
                        ppcVar6 = (char **)pd_maininstance.pd_stuff;
LAB_0016f518:
                        ((_instancestuff *)ppcVar6)->st_externlist = ptVar3;
                      }
                      else {
                        iVar2 = strcmp(pcVar8,"-font-size");
                        if ((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"-font"), iVar2 == 0)) {
                          if (argc == 1) goto LAB_0016f788;
                          iVar2 = atoi(argv[1]);
                          iVar2 = sys_nearestfontsize(iVar2);
                          piVar4 = &sys_defaultfont;
                          goto LAB_0016eeec;
                        }
                        iVar2 = strcmp(pcVar8,"-font-face");
                        if ((iVar2 != 0) && (iVar2 = strcmp(pcVar8,"-typeface"), iVar2 != 0)) {
                          iVar2 = strcmp(pcVar8,"-font-weight");
                          if (iVar2 == 0) {
                            if (argc == 1) goto LAB_0016f788;
                            strncpy(sys_fontweight,argv[1],9);
                            sys_fontweight[9] = '\0';
                            goto LAB_0016ee9b;
                          }
                          iVar2 = strcmp(pcVar8,"-verbose");
                          if (iVar2 == 0) {
                            sys_verbose = sys_verbose + 1;
                            goto LAB_0016ef10;
                          }
                          iVar2 = strcmp(pcVar8,"-noverbose");
                          if (iVar2 == 0) {
                            piVar4 = &sys_verbose;
                            goto LAB_0016f1a3;
                          }
                          iVar2 = strcmp(pcVar8,"-version");
                          if (iVar2 == 0) {
                            sys_version = 1;
                            goto LAB_0016ef10;
                          }
                          if (((*pcVar8 == '-') && (pcVar8[1] == 'd')) &&
                             (!(bool)(bVar10 ^ 1) && pcVar8[2] == '\0')) {
                            iVar2 = __isoc99_sscanf(argv[1],"%d",&sys_debuglevel);
                            if (0 < iVar2) goto LAB_0016ee9b;
                            pcVar8 = *argv;
                          }
                          iVar2 = strcmp(pcVar8,"-loadbang");
                          if (iVar2 == 0) {
                            piVar4 = &sys_noloadbang;
                            goto LAB_0016f1a3;
                          }
                          iVar2 = strcmp(pcVar8,"-noloadbang");
                          if (iVar2 == 0) {
                            piVar4 = &sys_noloadbang;
                            goto LAB_0016f43d;
                          }
                          iVar2 = strcmp(pcVar8,"-gui");
                          if (iVar2 != 0) {
                            iVar2 = strcmp(pcVar8,"-nogui");
                            if (iVar2 == 0) {
                              sys_dontstartgui = '\x01';
                              goto LAB_0016ef10;
                            }
                            iVar2 = strcmp(pcVar8,"-guiport");
                            if (iVar2 == 0 && !(bool)(bVar10 ^ 1U)) {
                              iVar2 = __isoc99_sscanf(argv[1],"%d",&sys_guisetportnumber);
                              if (0 < iVar2) goto LAB_0016ee9b;
                              pcVar8 = *argv;
                            }
                            iVar2 = strcmp(pcVar8,"-nostderr");
                            if (iVar2 == 0) {
                              piVar4 = &sys_printtostderr;
                              goto LAB_0016f1a3;
                            }
                            iVar2 = strcmp(pcVar8,"-stderr");
                            if (iVar2 == 0) {
                              piVar4 = &sys_printtostderr;
                              goto LAB_0016f43d;
                            }
                            iVar2 = strcmp(pcVar8,"-guicmd");
                            if (iVar2 == 0) {
                              if (argc == 1) goto LAB_0016f788;
                              ptVar3 = (t_namelist *)argv[1];
                              ppcVar6 = &sys_guicmd;
                              goto LAB_0016f518;
                            }
                            iVar2 = strcmp(pcVar8,"-send");
                            if (iVar2 == 0) {
                              if (argc == 1) goto LAB_0016f788;
                              sys_messagelist = namelist_append(sys_messagelist,argv[1],1);
                              goto LAB_0016ee9b;
                            }
                            iVar2 = strcmp(pcVar8,"-schedlib");
                            if (iVar2 == 0) {
                              if (argc == 1) goto LAB_0016f788;
                              sys_externalschedlib = 1;
                              strncpy(sys_externalschedlibname,argv[1],999);
                              as.a_api = 0;
                            }
                            else {
                              iVar2 = strcmp(pcVar8,"-extraflags");
                              if (iVar2 != 0) {
                                iVar2 = strcmp(pcVar8,"-batch");
                                if (iVar2 == 0) {
                                  sys_batch = '\x01';
                                }
                                else {
                                  iVar2 = strcmp(pcVar8,"-nobatch");
                                  if (iVar2 != 0) {
                                    iVar2 = strcmp(pcVar8,"-autopatch");
                                    if (iVar2 == 0) {
                                      piVar4 = &sys_noautopatch;
                                      goto LAB_0016f1a3;
                                    }
                                    iVar2 = strcmp(pcVar8,"-noautopatch");
                                    if (iVar2 == 0) {
                                      piVar4 = &sys_noautopatch;
LAB_0016f43d:
                                      *piVar4 = 1;
                                      goto LAB_0016ef10;
                                    }
                                    iVar2 = strcmp(pcVar8,"-compatibility");
                                    if (iVar2 == 0) {
                                      if ((argc == 1) ||
                                         (iVar2 = __isoc99_sscanf(argv[1],"%f",&f), iVar2 < 1))
                                      goto LAB_0016f788;
                                      pd_compatibilitylevel = (int)(f * 100.0 + 0.5);
                                      goto LAB_0016f6b7;
                                    }
                                    iVar2 = strcmp(pcVar8,"-rt");
                                    if ((iVar2 == 0) ||
                                       (iVar2 = strcmp(pcVar8,"-realtime"), iVar2 == 0)) {
                                      piVar4 = &sys_hipriority;
                                      goto LAB_0016f43d;
                                    }
                                    iVar2 = strcmp(pcVar8,"-nrt");
                                    if (((iVar2 == 0) ||
                                        (iVar2 = strcmp(pcVar8,"-nort"), iVar2 == 0)) ||
                                       (iVar2 = strcmp(pcVar8,"-norealtime"), iVar2 == 0)) {
                                      piVar4 = &sys_hipriority;
                                    }
                                    else {
                                      iVar2 = strcmp(pcVar8,"-sleep");
                                      if (iVar2 != 0) {
                                        iVar2 = strcmp(pcVar8,"-nosleep");
                                        if (iVar2 != 0) {
                                          iVar2 = strcmp(pcVar8,"-noprefs");
                                          if (iVar2 != 0) {
                                            iVar2 = strcmp(pcVar8,"-prefsfile");
                                            if ((bool)(bVar10 ^ 1U | iVar2 != 0)) goto LAB_0016f788;
                                            goto LAB_0016ee9b;
                                          }
                                          goto LAB_0016ef10;
                                        }
                                        piVar4 = &sys_nosleep;
                                        goto LAB_0016f43d;
                                      }
                                      piVar4 = &sys_nosleep;
                                    }
                                    goto LAB_0016f1a3;
                                  }
                                  sys_batch = '\0';
                                }
                                goto LAB_0016ef10;
                              }
                              if (argc == 1) goto LAB_0016f788;
                              sys_extraflags = 1;
                              strncpy(sys_extraflagsstring,argv[1],999);
                            }
LAB_0016f6b7:
                            argv = argv + 2;
                            argc = argc + -2;
                            goto LAB_0016e594;
                          }
                          sys_dontstartgui = '\0';
                          goto LAB_0016ef10;
                        }
                        if (argc == 1) goto LAB_0016f788;
                        strncpy(sys_font,argv[1],99);
                        sys_font[99] = '\0';
                      }
                    }
                  }
                  goto LAB_0016ee9b;
                }
                if (argc == 1) goto LAB_0016f788;
                if (sys_nmidiin < 0) {
                  sys_nmidiin = 0;
                }
                if (sys_nmidiout < 0) {
                  sys_nmidiout = 0;
                }
                if (0xf < (uint)(sys_nmidiin | sys_nmidiout)) {
                  pcVar8 = "number of MIDI devices limited to %d";
                  goto LAB_0016f531;
                }
                iVar2 = sys_mididevnametonumber(1,argv[1]);
                if (iVar2 < 0) {
                  fprintf(_stderr,"Couldn\'t find MIDI output device: %s\n",argv[1]);
                }
                else {
                  lVar5 = (long)sys_nmidiin;
                  sys_nmidiin = sys_nmidiin + 1;
                  sys_midioutdevlist[lVar5] = iVar2 + 1;
                }
              }
              iVar2 = sys_mididevnametonumber(1,argv[1]);
              if (iVar2 < 0) {
                pcVar8 = argv[1];
                pcVar7 = "Couldn\'t find MIDI output device: %s\n";
                goto LAB_0016ef54;
              }
              piVar4 = sys_midioutdevlist;
              iVar1 = sys_nmidiout;
              sys_nmidiout = sys_nmidiout + 1;
            }
            piVar4[iVar1] = iVar2 + 1;
            goto LAB_0016ee9b;
          }
          if (argc == 1) goto LAB_0016f788;
          sys_parsedevlist(&sys_nmidiin,sys_midiindevlist,0x10,argv[1]);
          pcVar8 = argv[1];
          piVar9 = &sys_nmidiout;
          piVar4 = sys_midioutdevlist;
        }
      }
      sys_parsedevlist(piVar9,piVar4,0x10,pcVar8);
      iVar2 = *piVar9;
      goto joined_r0x0016ee95;
    }
    as.a_blocksize = atoi(argv[1]);
  }
LAB_0016ee9b:
  argc = argc + -2;
  argv = argv + 2;
  goto LAB_0016e594;
LAB_0016f76f:
  if (sys_batch == '\x01') {
    sys_dontstartgui = '\x01';
  }
  else if (sys_dontstartgui != '\x01') goto LAB_0016f7af;
  sys_printtostderr = 1;
LAB_0016f7af:
  if (sys_defaultfont == 0) {
    sys_defaultfont = 0xc;
  }
  for (; 0 < argc; argc = argc + -1) {
    sys_openlist = namelist_append_files(sys_openlist,*argv);
    argv = argv + 1;
  }
  sys_set_audio_settings(&as);
  return 0;
}

Assistant:

int sys_argparse(int argc, const char **argv)
{
    t_audiosettings as;
            /* get the current audio parameters.  These are set
            by the preferences mechanism (sys_loadpreferences()) or
            else are the default.  Overwrite them with any results
            of argument parsing, and store them again. */
    sys_get_audio_settings(&as);
    while ((argc > 0) && **argv == '-')
    {
                /* audio flags */
        if (!strcmp(*argv, "-r") && argc > 1 &&
            sscanf(argv[1], "%d", &as.a_srate) >= 1)
        {
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-inchannels"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nchindev,
                    as.a_chindevvec, MAXAUDIOINDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-outchannels"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nchoutdev,
                    as.a_choutdevvec, MAXAUDIOINDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-channels"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nchindev,
                    as.a_chindevvec, MAXAUDIOINDEV, argv[1]) ||
                !sys_parsedevlist(&as.a_nchoutdev,
                    as.a_choutdevvec, MAXAUDIOINDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-soundbuf") || (!strcmp(*argv, "-audiobuf")))
        {
            if (argc < 2)
                goto usage;

            as.a_advance = atoi(argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-callback"))
        {
            as.a_callback = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nocallback"))
        {
            as.a_callback = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-blocksize"))
        {
            as.a_blocksize = atoi(argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-sleepgrain"))
        {
            if (argc < 2)
                goto usage;
            sys_sleepgrain = 1000 * atof(argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-nodac"))
        {
            as.a_noutdev = as.a_nchoutdev = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noadc"))
        {
            as.a_nindev = as.a_nchindev = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nosound") || !strcmp(*argv, "-noaudio"))
        {
            as.a_noutdev = as.a_nchoutdev =  as.a_nindev = as.a_nchindev = 0;
            argc--; argv++;
        }
#ifdef USEAPI_OSS
        else if (!strcmp(*argv, "-oss"))
        {
            as.a_api = API_OSS;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-ossmidi"))
        {
            sys_set_midi_api(API_OSS);
            argc--; argv++;
        }
#else
        else if ((!strcmp(*argv, "-oss")) || (!strcmp(*argv, "-ossmidi")))
        {
            fprintf(stderr, "Pd compiled without OSS-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
#ifdef USEAPI_ALSA
        else if (!strcmp(*argv, "-alsa"))
        {
            as.a_api = API_ALSA;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-alsaadd"))
        {
            if (argc < 2)
                goto usage;
            as.a_api = API_ALSA;
            alsa_adddev(argv[1]);
            argc -= 2; argv +=2;
        }
        else if (!strcmp(*argv, "-alsamidi"))
        {
            sys_set_midi_api(API_ALSA);
            argc--; argv++;
        }
#else
        else if ((!strcmp(*argv, "-alsa")) || (!strcmp(*argv, "-alsamidi")))
        {
            fprintf(stderr, "Pd compiled without ALSA-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-alsaadd"))
        {
            if (argc < 2)
                goto usage;
            fprintf(stderr, "Pd compiled without ALSA-support, ignoring '%s' flag\n", *argv);
            argc -= 2; argv +=2;
        }
#endif
#ifdef USEAPI_JACK
        else if (!strcmp(*argv, "-jack"))
        {
            as.a_api = API_JACK;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nojackconnect"))
        {
            as.a_api = API_JACK;
            jack_autoconnect(0);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-jackconnect"))
        {
            as.a_api = API_JACK;
            jack_autoconnect(1);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-jackname"))
        {
            if (argc < 2)
                goto usage;
            as.a_api = API_JACK;
            jack_client_name(argv[1]);
            argc -= 2; argv +=2;
        }
#else
        else if ((!strcmp(*argv, "-jack"))
            || (!strcmp(*argv, "-jackconnect"))
            || (!strcmp(*argv, "-nojackconnect")))
        {
            fprintf(stderr, "Pd compiled without JACK-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-jackname"))
        {
            if (argc < 2)
                goto usage;
            fprintf(stderr, "Pd compiled without JACK-support, ignoring '%s' flag\n", *argv);
            argc -= 2; argv +=2;
        }
#endif
#ifdef USEAPI_PORTAUDIO
        else if (!strcmp(*argv, "-pa") || !strcmp(*argv, "-portaudio")
            || !strcmp(*argv, "-asio"))
        {
            as.a_api = API_PORTAUDIO;
            sys_mmio = 0;
            argc--; argv++;
        }
#else
        else if ((!strcmp(*argv, "-pa")) || (!strcmp(*argv, "-portaudio")))
        {
            fprintf(stderr, "Pd compiled without PortAudio-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-asio"))
        {
            fprintf(stderr, "Pd compiled without ASIO-support, ignoring '%s' flag\n", *argv);
            argc -= 2; argv +=2;
        }
#endif
#ifdef USEAPI_MMIO
        else if (!strcmp(*argv, "-mmio"))
        {
            as.a_api = API_MMIO;
            sys_mmio = 1;
            argc--; argv++;
        }
#else
        else if (!strcmp(*argv, "-mmio"))
        {
            fprintf(stderr, "Pd compiled without MMIO-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
#ifdef USEAPI_AUDIOUNIT
        else if (!strcmp(*argv, "-audiounit"))
        {
            as.a_api = API_AUDIOUNIT;
            argc--; argv++;
        }
#else
        else if (!strcmp(*argv, "-audiounit"))
        {
            fprintf(stderr, "Pd compiled without AudioUnit-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
#ifdef USEAPI_ESD
        else if (!strcmp(*argv, "-esd"))
        {
            as.a_api = API_ESD;
            argc--; argv++;
        }
#else
        else if (!strcmp(*argv, "-esd"))
        {
            fprintf(stderr, "Pd compiled without ESD-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
        else if (!strcmp(*argv, "-listdev"))
        {
            sys_listplease = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-soundindev") ||
            !strcmp(*argv, "-audioindev"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nindev, as.a_indevvec,
                    MAXAUDIOINDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-soundoutdev") ||
            !strcmp(*argv, "-audiooutdev"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_noutdev, as.a_outdevvec,
                    MAXAUDIOOUTDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if ((!strcmp(*argv, "-sounddev") || !strcmp(*argv, "-audiodev")))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nindev, as.a_indevvec,
                    MAXAUDIOINDEV, argv[1]) ||
                !sys_parsedevlist(&as.a_noutdev, as.a_outdevvec,
                    MAXAUDIOOUTDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-audioaddindev"))
        {
            if (argc < 2)
                goto usage;

            if (as.a_nindev < 0)
                as.a_nindev = 0;
            if (as.a_nindev < MAXAUDIOINDEV)
            {
                int devn = sys_audiodevnametonumber(0, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find audio input device: %s\n",
                        argv[1]);
                else as.a_indevvec[as.a_nindev++] = devn + 1;
            }
            else fprintf(stderr, "number of audio devices limited to %d\n",
                MAXAUDIOINDEV);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-audioaddoutdev"))
        {
            if (argc < 2)
                goto usage;

            if (as.a_noutdev < 0)
                as.a_noutdev = 0;
            if (as.a_noutdev < MAXAUDIOINDEV)
            {
                int devn = sys_audiodevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find audio output device: %s\n",
                        argv[1]);
                else as.a_outdevvec[as.a_noutdev++] = devn + 1;
            }
            else fprintf(stderr, "number of audio devices limited to %d\n",
                MAXAUDIOINDEV);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-audioadddev"))
        {
            if (argc < 2)
                goto usage;

            if (as.a_nindev < 0)
                as.a_nindev = 0;
            if (as.a_noutdev < 0)
                as.a_noutdev = 0;
            if (as.a_nindev < MAXAUDIOINDEV && as.a_noutdev < MAXAUDIOINDEV)
            {
                int devn = sys_audiodevnametonumber(0, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find audio input device: %s\n",
                        argv[1]);
                else as.a_indevvec[as.a_nindev++] = devn + 1;
                devn = sys_audiodevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find audio output device: %s\n",
                        argv[1]);
                else as.a_outdevvec[as.a_noutdev++] = devn + 1;
            }
            else fprintf(stderr, "number of audio devices limited to %d",
                MAXAUDIOINDEV);
            argc -= 2; argv += 2;
        }
                /* MIDI flags */
        else if (!strcmp(*argv, "-nomidiin"))
        {
            sys_nmidiin = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nomidiout"))
        {
            sys_nmidiout = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nomidi"))
        {
            sys_nmidiin = sys_nmidiout = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-midiindev"))
        {
            if (argc < 2)
                goto usage;

            sys_parsedevlist(&sys_nmidiin, sys_midiindevlist, MAXMIDIINDEV,
                argv[1]);
            if (!sys_nmidiin)
                goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-midioutdev"))
        {
            if (argc < 2)
                goto usage;

            sys_parsedevlist(&sys_nmidiout, sys_midioutdevlist, MAXMIDIOUTDEV,
                argv[1]);
            if (!sys_nmidiout)
                goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-mididev"))
        {
            if (argc < 2)
                goto usage;

            sys_parsedevlist(&sys_nmidiin, sys_midiindevlist, MAXMIDIINDEV,
                argv[1]);
            sys_parsedevlist(&sys_nmidiout, sys_midioutdevlist, MAXMIDIOUTDEV,
                argv[1]);
            if (!sys_nmidiout)
                goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-midiaddindev"))
        {
            if (argc < 2)
                goto usage;

            if (sys_nmidiin < 0)
                sys_nmidiin = 0;
            if (sys_nmidiin < MAXMIDIINDEV)
            {
                int devn = sys_mididevnametonumber(0, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find MIDI input device: %s\n",
                        argv[1]);
                else sys_midiindevlist[sys_nmidiin++] = devn + 1;
            }
            else fprintf(stderr, "number of MIDI devices limited to %d\n",
                MAXMIDIINDEV);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-midiaddoutdev"))
        {
            if (argc < 2)
                goto usage;

            if (sys_nmidiout < 0)
                sys_nmidiout = 0;
            if (sys_nmidiout < MAXMIDIINDEV)
            {
                int devn = sys_mididevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find MIDI output device: %s\n",
                        argv[1]);
                else sys_midioutdevlist[sys_nmidiout++] = devn + 1;
            }
            else fprintf(stderr, "number of MIDI devices limited to %d\n",
                MAXMIDIINDEV);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-midiadddev"))
        {
            if (argc < 2)
                goto usage;

            if (sys_nmidiin < 0)
                sys_nmidiin = 0;
            if (sys_nmidiout < 0)
                sys_nmidiout = 0;
            if (sys_nmidiin < MAXMIDIINDEV && sys_nmidiout < MAXMIDIINDEV)
            {
                int devn = sys_mididevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find MIDI output device: %s\n",
                        argv[1]);
                else sys_midioutdevlist[sys_nmidiin++] = devn + 1;
                devn = sys_mididevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find MIDI output device: %s\n",
                        argv[1]);
                else sys_midioutdevlist[sys_nmidiout++] = devn + 1;
            }
            else fprintf(stderr, "number of MIDI devices limited to %d",
                MAXMIDIINDEV);
            argc -= 2; argv += 2;
        }
                /* other flags */
        else if (!strcmp(*argv, "-path"))
        {
            if (argc < 2)
                goto usage;
            STUFF->st_temppath =
                namelist_append_files(STUFF->st_temppath, argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-nostdpath"))
        {
            sys_usestdpath = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-stdpath"))
        {
            sys_usestdpath = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-helppath"))
        {
            if (argc < 2)
                goto usage;
            STUFF->st_helppath =
                namelist_append_files(STUFF->st_helppath, argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-open"))
        {
            if (argc < 2)
                goto usage;

            sys_openlist = namelist_append_files(sys_openlist, argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-lib"))
        {
            if (argc < 2)
                goto usage;

            STUFF->st_externlist =
                namelist_append_files(STUFF->st_externlist, argv[1]);
            argc -= 2; argv += 2;
        }
        else if ((!strcmp(*argv, "-font-size") || !strcmp(*argv, "-font")))
        {
            if (argc < 2)
                goto usage;

            sys_defaultfont = sys_nearestfontsize(atoi(argv[1]));
            argc -= 2;
            argv += 2;
        }
        else if ((!strcmp(*argv, "-font-face") || !strcmp(*argv, "-typeface")))
        {
            if (argc < 2)
                goto usage;

            strncpy(sys_font,*(argv+1),sizeof(sys_font)-1);
            sys_font[sizeof(sys_font)-1] = 0;
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-font-weight"))
        {
            if (argc < 2)
                goto usage;

            strncpy(sys_fontweight,*(argv+1),sizeof(sys_fontweight)-1);
            sys_fontweight[sizeof(sys_fontweight)-1] = 0;
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-verbose"))
        {
            sys_verbose++;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noverbose"))
        {
            sys_verbose=0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-version"))
        {
            sys_version = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-d") && argc > 1 &&
            sscanf(argv[1], "%d", &sys_debuglevel) >= 1)
        {
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-loadbang"))
        {
            sys_noloadbang = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noloadbang"))
        {
            sys_noloadbang = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-gui"))
        {
            sys_dontstartgui = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nogui"))
        {
            sys_dontstartgui = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-guiport") && argc > 1 &&
            sscanf(argv[1], "%d", &sys_guisetportnumber) >= 1)
        {
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-nostderr"))
        {
            sys_printtostderr = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-stderr"))
        {
            sys_printtostderr = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-guicmd"))
        {
            if (argc < 2)
                goto usage;

            sys_guicmd = argv[1];
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-send"))
        {
            if (argc < 2)
                goto usage;

            sys_messagelist = namelist_append(sys_messagelist, argv[1], 1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-schedlib"))
        {
            if (argc < 2)
                goto usage;

            sys_externalschedlib = 1;
            strncpy(sys_externalschedlibname, argv[1],
                sizeof(sys_externalschedlibname) - 1);
#ifndef  __APPLE__
                /* no audio I/O please, unless overwritten by later args.
                This is to circumvent a problem running pd~ subprocesses
                with -nogui; they would open an audio device before pdsched.c
                could set the API to nothing.  For some reason though, on
                MACOSX this causes Pd to switch to JACK so we just give up
                and suppress the workaround there. */
            as.a_api = 0;
#endif
            argv += 2;
            argc -= 2;
        }
        else if (!strcmp(*argv, "-extraflags"))
        {
            if (argc < 2)
                goto usage;

            sys_extraflags = 1;
            strncpy(sys_extraflagsstring, argv[1],
                sizeof(sys_extraflagsstring) - 1);
            argv += 2;
            argc -= 2;
        }
        else if (!strcmp(*argv, "-batch"))
        {
            sys_batch = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nobatch"))
        {
            sys_batch = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-autopatch"))
        {
            sys_noautopatch = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noautopatch"))
        {
            sys_noautopatch = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-compatibility"))
        {
            float f;
            if (argc < 2)
                goto usage;

            if (sscanf(argv[1], "%f", &f) < 1)
                goto usage;
            pd_compatibilitylevel = 0.5 + 100. * f; /* e.g., 2.44 --> 244 */
            argv += 2;
            argc -= 2;
        }
#ifdef HAVE_UNISTD_H
        else if (!strcmp(*argv, "-rt") || !strcmp(*argv, "-realtime"))
        {
            sys_hipriority = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nrt") || !strcmp(*argv, "-nort") || !strcmp(*argv, "-norealtime"))
        {
            sys_hipriority = 0;
            argc--; argv++;
        }
#else
        else if (!strcmp(*argv, "-rt") || !strcmp(*argv, "-realtime")
                 || !strcmp(*argv, "-nrt") || !strcmp(*argv, "-nort")
                 || !strcmp(*argv, "-norealtime"))
        {
            fprintf(stderr, "Pd compiled without realtime priority-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
        else if (!strcmp(*argv, "-sleep"))
        {
            sys_nosleep = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nosleep"))
        {
            sys_nosleep = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noprefs")) /* did this earlier */
            argc--, argv++;
        else if (!strcmp(*argv, "-prefsfile") && argc > 1) /* this too */
            argc -= 2, argv +=2;
        else
        {
        usage:
            sys_printusage();
            return (1);
        }
    }
    if (sys_batch)
        sys_dontstartgui = 1;
    if (sys_dontstartgui)
        sys_printtostderr = 1;
#ifdef _WIN32
    if (sys_printtostderr)
        /* we need to tell Windows to output UTF-8 */
        SetConsoleOutputCP(CP_UTF8);
#endif
    if (!sys_defaultfont)
        sys_defaultfont = DEFAULTFONT;
    for (; argc > 0; argc--, argv++)
        sys_openlist = namelist_append_files(sys_openlist, *argv);

    sys_set_audio_settings(&as);
    return (0);
}